

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupContextItem(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  char *in_RDI;
  ImGuiID unaff_retaddr;
  undefined4 unaff_retaddr_00;
  int mouse_button;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiPopupFlags in_stack_00000030;
  ImGuiID in_stack_00000034;
  ImGuiID local_34;
  ImGuiHoveredFlags flags;
  undefined4 in_stack_fffffffffffffff8;
  ImGuiWindowFlags in_stack_fffffffffffffffc;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    if (in_RDI == (char *)0x0) {
      local_34 = (GImGui->LastItemData).ID;
    }
    else {
      local_34 = ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(unaff_retaddr_00,unaff_retaddr),
                                    (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8),in_RDI);
    }
    flags = (ImGuiHoveredFlags)in_RDI;
    bVar1 = IsMouseReleased(local_34);
    if ((bVar1) && (bVar1 = IsItemHovered(flags), bVar1)) {
      OpenPopupEx(in_stack_00000034,in_stack_00000030);
    }
    bVar1 = BeginPopupEx(unaff_retaddr,in_stack_fffffffffffffffc);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::BeginPopupContextItem(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;
    ImGuiID id = str_id ? window->GetID(str_id) : g.LastItemData.ID;    // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
    IM_ASSERT(id != 0);                                             // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
        OpenPopupEx(id, popup_flags);
    return BeginPopupEx(id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings);
}